

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractStage.h
# Opt level: O0

OutputPort<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
* __thiscall
teetime::AbstractStage::addNewOutputPort<std::pair<std::__cxx11::string,teetime::Image>>
          (AbstractStage *this)

{
  logic_error *this_00;
  OutputPort<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
  *this_01;
  unique_ptr<teetime::AbstractOutputPort,_std::default_delete<teetime::AbstractOutputPort>_>
  local_30;
  OutputPort<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
  *local_28;
  OutputPort<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
  *port;
  AbstractStage *local_10;
  AbstractStage *this_local;
  
  local_10 = this;
  if (this->m_state != Created) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"cannot create new ports after stage has been started");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this_01 = (OutputPort<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
             *)operator_new(0x18);
  OutputPort<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
  ::OutputPort(this_01,this);
  local_28 = this_01;
  std::unique_ptr<teetime::AbstractOutputPort,std::default_delete<teetime::AbstractOutputPort>>::
  unique_ptr<std::default_delete<teetime::AbstractOutputPort>,void>
            ((unique_ptr<teetime::AbstractOutputPort,std::default_delete<teetime::AbstractOutputPort>>
              *)&local_30,(pointer)this_01);
  std::
  vector<std::unique_ptr<teetime::AbstractOutputPort,_std::default_delete<teetime::AbstractOutputPort>_>,_std::allocator<std::unique_ptr<teetime::AbstractOutputPort,_std::default_delete<teetime::AbstractOutputPort>_>_>_>
  ::push_back(&this->m_outputPorts,(value_type *)&local_30);
  std::unique_ptr<teetime::AbstractOutputPort,_std::default_delete<teetime::AbstractOutputPort>_>::
  ~unique_ptr(&local_30);
  return local_28;
}

Assistant:

OutputPort<T>* AbstractStage::addNewOutputPort()
  {
    if(m_state != StageState::Created)
    {
      throw std::logic_error("cannot create new ports after stage has been started");
    }

    OutputPort<T>* port = new OutputPort<T>(this);
    m_outputPorts.push_back(unique_ptr<AbstractOutputPort>(port));
    return port;
  }